

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgtbb(fitsfile *fptr,LONGLONG firstrow,LONGLONG firstchar,LONGLONG nchars,uchar *values,
          int *status)

{
  fitsfile *in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  LONGLONG in_R8;
  int *in_R9;
  LONGLONG endrow;
  LONGLONG bytepos;
  int local_4;
  
  if ((*in_R9 < 1) && (0 < (long)in_RCX)) {
    if (in_RSI < 1) {
      *in_R9 = 0x133;
      local_4 = 0x133;
    }
    else if (in_RDX < 1) {
      *in_R9 = 0x134;
      local_4 = 0x134;
    }
    else {
      if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        ffmahd(fptr,firstrow._4_4_,(int *)firstchar,(int *)nchars);
      }
      if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) <
          ((long)in_RCX + in_RDX + -2) / *(long *)(*(long *)(in_RDI + 2) + 0x3c8) + in_RSI) {
        ffpmsg((char *)0x2569b5);
        *in_R9 = 0x133;
        local_4 = 0x133;
      }
      else {
        ffmbyt(in_RCX,in_R8,(int)((ulong)in_R9 >> 0x20),
               (int *)(*(long *)(*(long *)(in_RDI + 2) + 0x88) +
                       *(long *)(*(long *)(in_RDI + 2) + 0x3c8) * (in_RSI + -1) + in_RDX + -1));
        ffgbyt((fitsfile *)values,(LONGLONG)status,(void *)bytepos,(int *)endrow);
        local_4 = *in_R9;
      }
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgtbb(fitsfile *fptr,        /* I - FITS file pointer                 */
           LONGLONG firstrow,         /* I - starting row (1 = first row)      */
           LONGLONG firstchar,        /* I - starting byte in row (1=first)    */
           LONGLONG nchars,           /* I - number of bytes to read           */
           unsigned char *values, /* I - array of bytes to read            */
           int *status)           /* IO - error status                     */
/*
  read a consecutive string of bytes from an ascii or binary table.
  This will span multiple rows of the table if nchars + firstchar is
  greater than the length of a row.
*/
{
    LONGLONG bytepos, endrow;

    if (*status > 0 || nchars <= 0)
        return(*status);

    else if (firstrow < 1)
        return(*status=BAD_ROW_NUM);

    else if (firstchar < 1)
        return(*status=BAD_ELEM_NUM);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* check that we do not exceed number of rows in the table */
    endrow = ((firstchar + nchars - 2) / (fptr->Fptr)->rowlength) + firstrow;
    if (endrow > (fptr->Fptr)->numrows)
    {
        ffpmsg("attempt to read past end of table (ffgtbb)");
        return(*status=BAD_ROW_NUM);
    }

    /* move the i/o pointer to the start of the sequence of characters */
    bytepos = (fptr->Fptr)->datastart +
              ((fptr->Fptr)->rowlength * (firstrow - 1)) +
              firstchar - 1;

    ffmbyt(fptr, bytepos, REPORT_EOF, status);
    ffgbyt(fptr, nchars, values, status);  /* read the bytes */

    return(*status);
}